

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_endec_filter.hxx
# Opt level: O0

bool __thiscall
cryptox::basic_endec_filter<cryptox::decryptor<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>_>_>::
filter(basic_endec_filter<cryptox::decryptor<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>_>_>
       *this,char **src_begin,char *src_end,char **dest_begin,char *dest_end,bool must_flush)

{
  char *first;
  char **last;
  bool bVar1;
  evp_cipher_context<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>,&EVP_DecryptInit_ex,&EVP_DecryptUpdate,&EVP_DecryptFinal_ex>
  *this_00;
  difference_type dVar2;
  unsigned_long *puVar3;
  iterator local_150;
  iterator local_130;
  _Self local_110;
  const_iterator local_f0;
  iterator local_d0;
  const_iterator local_b0;
  iterator local_90;
  size_type local_70;
  unsigned_long local_68;
  size_t output_capacity;
  deque<char,_std::allocator<char>_> *local_58;
  unsigned_long local_50;
  size_t output_size;
  size_t input_size;
  char *pcStack_38;
  bool must_flush_local;
  char *dest_end_local;
  char **dest_begin_local;
  char *src_end_local;
  char **src_begin_local;
  basic_endec_filter<cryptox::decryptor<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>_>_>
  *this_local;
  
  input_size._7_1_ = must_flush;
  pcStack_38 = dest_end;
  dest_end_local = (char *)dest_begin;
  dest_begin_local = (char **)src_end;
  src_end_local = (char *)src_begin;
  src_begin_local = (char **)this;
  output_size = std::distance<char_const*>(*src_begin,src_end);
  local_50 = std::distance<char*>(*(char **)dest_end_local,pcStack_38);
  this_00 = (evp_cipher_context<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>,&EVP_DecryptInit_ex,&EVP_DecryptUpdate,&EVP_DecryptFinal_ex>
             *)std::auto_ptr<cryptox::decryptor<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>_>_>::
               operator->(&this->_endec);
  last = dest_begin_local;
  first = *(char **)src_end_local;
  local_58 = (deque<char,_std::allocator<char>_> *)
             std::back_inserter<std::deque<char,std::allocator<char>>>(&this->_output);
  output_capacity =
       (size_t)evp_cipher_context<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>,&EVP_DecryptInit_ex,&EVP_DecryptUpdate,&EVP_DecryptFinal_ex>
               ::
               update<char_const*,std::back_insert_iterator<std::deque<char,std::allocator<char>>>>
                         (this_00,first,(char *)last,
                          (back_insert_iterator<std::deque<char,_std::allocator<char>_>_>)local_58);
  dVar2 = std::distance<char_const*>(*(char **)src_end_local,(char *)dest_begin_local);
  this->_total_input = dVar2 + this->_total_input;
  *(char ***)src_end_local = dest_begin_local;
  local_70 = std::deque<char,_std::allocator<char>_>::size(&this->_output);
  puVar3 = std::min<unsigned_long>(&local_50,&local_70);
  local_68 = *puVar3;
  bVar1 = std::deque<char,_std::allocator<char>_>::empty(&this->_output);
  if (!bVar1) {
    std::deque<char,_std::allocator<char>_>::begin(&local_90,&this->_output);
    std::copy_n<std::_Deque_iterator<char,char&,char*>,unsigned_long,char*>
              (&local_90,local_68,*(char **)dest_end_local);
    std::deque<char,_std::allocator<char>_>::begin(&local_d0,&this->_output);
    std::_Deque_iterator<char,char_const&,char_const*>::
    _Deque_iterator<std::_Deque_iterator<char,char&,char*>,void>
              ((_Deque_iterator<char,char_const&,char_const*> *)&local_b0,&local_d0);
    std::deque<char,_std::allocator<char>_>::begin(&local_130,&this->_output);
    std::operator+(&local_110,&local_130,local_68);
    std::_Deque_iterator<char,char_const&,char_const*>::
    _Deque_iterator<std::_Deque_iterator<char,char&,char*>,void>
              ((_Deque_iterator<char,char_const&,char_const*> *)&local_f0,&local_110);
    std::deque<char,_std::allocator<char>_>::erase(&local_150,&this->_output,&local_b0,&local_f0);
    *(unsigned_long *)dest_end_local = local_68 + *(long *)dest_end_local;
    this->_total_output = local_68 + this->_total_output;
  }
  if ((input_size._7_1_ & 1) == 0) {
    this_local._7_1_ = output_size != 0;
  }
  else {
    finalize(this);
    bVar1 = std::deque<char,_std::allocator<char>_>::empty(&this->_output);
    this_local._7_1_ = (bool)((bVar1 ^ 0xffU) & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool filter(const char*& src_begin, const char* src_end, char*& dest_begin, char* dest_end, bool must_flush) {
			const size_t  input_size = std::distance( src_begin,  src_end);
			const size_t output_size = std::distance(dest_begin, dest_end);

			// Process Input...
			_endec->update(src_begin, src_end, std::back_inserter(_output));
			_total_input += std::distance(src_begin, src_end);
			src_begin = src_end;

			// Process Output...
			const size_t output_capacity = std::min BOOST_PREVENT_MACRO_SUBSTITUTION(
				output_size,
				_output.size()
			);

			if (!_output.empty()) {
				std::copy_n(_output.begin(), output_capacity, dest_begin);
				_output.erase(_output.begin(), _output.begin() + output_capacity);
				dest_begin += output_capacity;
				_total_output += output_capacity;
			}

			if (must_flush) {
				finalize();
				return !_output.empty();
			}

			return input_size != 0;
		}